

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_request_pty_size
              (LIBSSH2_CHANNEL *channel,int width,int height,int width_px,int height_px)

{
  int iVar1;
  int local_40;
  int retcode;
  int rc;
  uchar *s;
  LIBSSH2_SESSION *session;
  int height_px_local;
  int width_px_local;
  int height_local;
  int width_local;
  LIBSSH2_CHANNEL *channel_local;
  
  s = (uchar *)channel->session;
  local_40 = -0xe;
  session._0_4_ = height_px;
  session._4_4_ = width_px;
  height_px_local = height;
  width_px_local = width;
  _height_local = channel;
  if (channel->reqPTY_state == libssh2_NB_state_idle) {
    channel->reqPTY_packet_len = 0x27;
    memset(&channel->reqPTY_packet_requirev_state,0,8);
    _retcode = _height_local->reqPTY_packet + 1;
    _height_local->reqPTY_packet[0] = 'b';
    _libssh2_store_u32((uchar **)&retcode,(_height_local->remote).id);
    _libssh2_store_str((uchar **)&retcode,"window-change",0xd);
    *_retcode = '\0';
    _retcode = _retcode + 1;
    _libssh2_store_u32((uchar **)&retcode,width_px_local);
    _libssh2_store_u32((uchar **)&retcode,height_px_local);
    _libssh2_store_u32((uchar **)&retcode,session._4_4_);
    _libssh2_store_u32((uchar **)&retcode,(uint32_t)session);
    _height_local->reqPTY_state = libssh2_NB_state_created;
  }
  if (_height_local->reqPTY_state == libssh2_NB_state_created) {
    iVar1 = _libssh2_transport_send
                      ((LIBSSH2_SESSION *)s,_height_local->reqPTY_packet,
                       _height_local->reqPTY_packet_len,(uchar *)0x0,0);
    if (iVar1 == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)s,-0x25,"Would block sending window-change request");
      return -0x25;
    }
    if (iVar1 != 0) {
      _height_local->reqPTY_state = libssh2_NB_state_idle;
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)s,iVar1,"Unable to send window-change packet");
      return iVar1;
    }
    _libssh2_htonu32(_height_local->reqPTY_local_channel,(_height_local->local).id);
    local_40 = 0;
  }
  _height_local->reqPTY_state = libssh2_NB_state_idle;
  return local_40;
}

Assistant:

static int
channel_request_pty_size(LIBSSH2_CHANNEL * channel, int width,
                         int height, int width_px, int height_px)
{
    LIBSSH2_SESSION *session = channel->session;
    unsigned char *s;
    int rc;
    int retcode = LIBSSH2_ERROR_PROTO;

    if(channel->reqPTY_state == libssh2_NB_state_idle) {
        channel->reqPTY_packet_len = 39;

        /* Zero the whole thing out */
        memset(&channel->reqPTY_packet_requirev_state, 0,
               sizeof(channel->reqPTY_packet_requirev_state));

        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "changing tty size on channel %lu/%lu",
                       channel->local.id,
                       channel->remote.id));

        s = channel->reqPTY_packet;

        *(s++) = SSH_MSG_CHANNEL_REQUEST;
        _libssh2_store_u32(&s, channel->remote.id);
        _libssh2_store_str(&s, (char *)"window-change",
                           sizeof("window-change") - 1);
        *(s++) = 0x00; /* Don't reply */
        _libssh2_store_u32(&s, width);
        _libssh2_store_u32(&s, height);
        _libssh2_store_u32(&s, width_px);
        _libssh2_store_u32(&s, height_px);

        channel->reqPTY_state = libssh2_NB_state_created;
    }

    if(channel->reqPTY_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, channel->reqPTY_packet,
                                     channel->reqPTY_packet_len,
                                     NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, rc,
                           "Would block sending window-change request");
            return rc;
        }
        else if(rc) {
            channel->reqPTY_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc,
                                  "Unable to send window-change packet");
        }
        _libssh2_htonu32(channel->reqPTY_local_channel, channel->local.id);
        retcode = LIBSSH2_ERROR_NONE;
    }

    channel->reqPTY_state = libssh2_NB_state_idle;
    return retcode;
}